

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_com.c
# Opt level: O3

MPP_RET hal_vp9d_output_probe(void *buf,void *dxva)

{
  RK_U64 *ptr;
  bool bVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  undefined8 *puVar5;
  long lVar6;
  void *pvVar7;
  vp9_prob (*paavVar8) [10] [9];
  vp9_prob (*pavVar9) [9];
  ulong uVar10;
  bool bVar11;
  ushort uVar12;
  long lVar13;
  ulong uVar14;
  undefined4 *puVar15;
  ulong uVar16;
  int iVar17;
  void *pvVar18;
  vp9_prob (*pavVar19) [9];
  undefined1 *puVar20;
  bool bVar21;
  long lVar22;
  long lVar23;
  RK_U64 invalue;
  byte bVar24;
  BitputCtx_t bp;
  vp9_prob partition_probs [16] [3];
  vp9_prob uv_mode_prob [10] [9];
  long local_118;
  BitputCtx_t local_108;
  void *local_e8;
  long local_e0;
  RK_U64 *local_d8;
  void *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98 [3];
  undefined1 local_7d [27];
  undefined1 local_62 [27];
  byte abStack_47 [7];
  undefined2 local_40;
  
  bVar24 = 0;
  uVar12 = *(ushort *)((long)dxva + 2) & 0x81;
  local_d0 = buf;
  memset(buf,0,0x980);
  if (uVar12 == 1) {
    local_c8 = *(undefined8 *)((long)dxva + 0x1d7);
    uStack_c0 = *(undefined8 *)((long)dxva + 0x1df);
    local_b8 = *(undefined8 *)((long)dxva + 0x1e7);
    uStack_b0 = *(undefined8 *)((long)dxva + 0x1ef);
    local_a8 = *(undefined8 *)((long)dxva + 0x1f7);
    uStack_a0 = *(undefined8 *)((long)dxva + 0x1ff);
    puVar15 = (undefined4 *)((long)dxva + 0xf4);
    puVar5 = local_98;
    for (lVar3 = 0x16; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined4 *)puVar5 = *puVar15;
      puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
      puVar5 = (undefined8 *)((long)puVar5 + ((ulong)bVar24 * -2 + 1) * 4);
    }
    local_40 = *(undefined2 *)((long)dxva + 0x14c);
  }
  else {
    local_a8._0_1_ = '\v';
    local_a8._1_1_ = '\x18';
    local_a8._2_1_ = '\a';
    local_a8._3_1_ = '\x05';
    local_a8._4_1_ = 0xae;
    local_a8._5_1_ = '#';
    local_a8._6_1_ = '1';
    local_a8._7_1_ = 'D';
    uStack_a0._0_1_ = '\v';
    uStack_a0._1_1_ = '\x1b';
    uStack_a0._2_1_ = '9';
    uStack_a0._3_1_ = '\x0f';
    uStack_a0._4_1_ = '\t';
    uStack_a0._5_1_ = '\f';
    uStack_a0._6_1_ = '\x03';
    uStack_a0._7_1_ = '\x03';
    local_b8._0_1_ = '\x14';
    local_b8._1_1_ = '0';
    local_b8._2_1_ = 'S';
    local_b8._3_1_ = '5';
    local_b8._4_1_ = '\x18';
    local_b8._5_1_ = '4';
    local_b8._6_1_ = '\x12';
    local_b8._7_1_ = '\x12';
    uStack_b0._0_1_ = 0x96;
    uStack_b0._1_1_ = '(';
    uStack_b0._2_1_ = '\'';
    uStack_b0._3_1_ = 'N';
    uStack_b0._4_1_ = '\f';
    uStack_b0._5_1_ = '\x1a';
    uStack_b0._6_1_ = 'C';
    uStack_b0._7_1_ = '!';
    local_c8._0_1_ = 0x9e;
    local_c8._1_1_ = 'a';
    local_c8._2_1_ = '^';
    local_c8._3_1_ = ']';
    local_c8._4_1_ = '\x18';
    local_c8._5_1_ = 'c';
    local_c8._6_1_ = 'U';
    local_c8._7_1_ = 'w';
    uStack_c0._0_1_ = ',';
    uStack_c0._1_1_ = '>';
    uStack_c0._2_1_ = ';';
    uStack_c0._3_1_ = 'C';
    uStack_c0._4_1_ = 0x95;
    uStack_c0._5_1_ = '5';
    uStack_c0._6_1_ = '5';
    uStack_c0._7_1_ = '^';
    pavVar19 = vp9_kf_uv_mode_prob;
    puVar5 = local_98;
    for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *(undefined8 *)*pavVar19;
      pavVar19 = (vp9_prob (*) [9])((long)pavVar19 + ((ulong)bVar24 * -2 + 1) * 8);
      puVar5 = puVar5 + (ulong)bVar24 * -2 + 1;
    }
    local_40 = 0x803b;
  }
  local_d8 = (RK_U64 *)mpp_osal_calloc("hal_vp9d_output_probe",0x988);
  mpp_set_bitput_ctx(&local_108,local_d8,0x130);
  puVar5 = &local_c8;
  lVar3 = 0;
  do {
    lVar22 = -3;
    do {
      mpp_put_bits(&local_108,(ulong)*(byte *)((long)puVar5 + lVar22 + 3),8);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 0);
    lVar3 = lVar3 + 1;
    puVar5 = (undefined8 *)((long)puVar5 + 3);
  } while (lVar3 != 0x10);
  lVar3 = 0;
  do {
    mpp_put_bits(&local_108,(ulong)*(byte *)((long)dxva + lVar3 + 0x76),8);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    mpp_put_bits(&local_108,(ulong)*(byte *)((long)dxva + lVar3 + 0x6f),8);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 7);
  lVar3 = 0;
  do {
    mpp_put_bits(&local_108,(ulong)*(byte *)((long)dxva + lVar3 + 399),8);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  bVar1 = true;
  local_e8 = dxva;
  do {
    bVar11 = bVar1;
    lVar22 = 0;
    do {
      mpp_put_bits(&local_108,(ulong)*(byte *)((long)dxva + lVar22 + lVar3 * 3 + 0x183),8);
      pvVar18 = local_e8;
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    lVar3 = 1;
    bVar1 = false;
  } while (bVar11);
  mpp_put_bits(&local_108,(ulong)*(byte *)((long)local_e8 + 0x189),8);
  mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + 0x18a),8);
  mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + 0x18b),8);
  mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + 0x18c),8);
  mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + 0x18d),8);
  mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + 0x18e),8);
  lVar3 = 0;
  do {
    mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + lVar3 + 0x16b),8);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  mpp_put_align(&local_108,0x80,0);
  if (uVar12 == 1) {
    lVar3 = (long)pvVar18 + 0xd0;
    lVar22 = 0;
    do {
      lVar23 = 0;
      do {
        mpp_put_bits(&local_108,(ulong)*(byte *)(lVar3 + lVar23),8);
        lVar23 = lVar23 + 1;
      } while (lVar23 != 9);
      lVar22 = lVar22 + 1;
      lVar3 = lVar3 + 9;
    } while (lVar22 != 4);
    lVar3 = 0;
    do {
      mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + lVar3 + 0x16f),8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    lVar3 = 0;
    do {
      mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + lVar3 + 0x17e),8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    lVar3 = 0;
    do {
      mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + lVar3 * 2 + 0x174),8);
      mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + lVar3 * 2 + 0x175),8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    lVar3 = (long)pvVar18 + 0x156;
    lVar22 = 0;
    do {
      lVar23 = 0;
      do {
        mpp_put_bits(&local_108,(ulong)*(byte *)(lVar3 + lVar23),8);
        lVar23 = lVar23 + 1;
      } while (lVar23 != 3);
      lVar22 = lVar22 + 1;
      lVar3 = lVar3 + 3;
    } while (lVar22 != 7);
    lVar3 = 0;
    do {
      mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + lVar3 * 2 + 0x14e),8);
      mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + lVar3 * 2 + 0x14f),8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    lVar3 = 0;
    mpp_put_align(&local_108,0x80,0);
    local_118 = (long)pvVar18 + 0x207;
    do {
      lVar22 = 0;
      local_e0 = lVar3;
      bVar1 = true;
      do {
        bVar11 = bVar1;
        lVar3 = lVar22 * 0xd8 + local_118;
        lVar22 = 0;
        iVar17 = 0;
        do {
          lVar6 = 0;
          lVar23 = lVar3;
          do {
            lVar13 = -3;
            do {
              mpp_put_bits(&local_108,(ulong)*(byte *)(lVar23 + 3 + lVar13),8);
              iVar17 = iVar17 + 1;
              if (iVar17 == 0x1b) {
                iVar17 = 0;
                mpp_put_align(&local_108,0x80,0);
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0);
            lVar6 = lVar6 + 1;
            lVar23 = lVar23 + 3;
          } while (lVar6 != 6);
          lVar22 = lVar22 + 1;
          lVar3 = lVar3 + 0x12;
        } while (lVar22 != 6);
        mpp_put_align(&local_108,0x80,0);
        lVar22 = 1;
        bVar1 = false;
      } while (bVar11);
      lVar3 = local_e0 + 1;
      local_118 = local_118 + 0x1b0;
    } while (lVar3 != 4);
    local_118 = (long)local_e8 + 0x273;
    lVar3 = 0;
    do {
      lVar22 = 0;
      local_e0 = lVar3;
      bVar1 = true;
      do {
        bVar11 = bVar1;
        lVar3 = lVar22 * 0xd8 + local_118;
        lVar22 = 0;
        iVar17 = 0;
        do {
          lVar6 = 0;
          lVar23 = lVar3;
          do {
            lVar13 = -3;
            do {
              mpp_put_bits(&local_108,(ulong)*(byte *)(lVar23 + 3 + lVar13),8);
              iVar17 = iVar17 + 1;
              if (iVar17 == 0x1b) {
                iVar17 = 0;
                mpp_put_align(&local_108,0x80,0);
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0);
            lVar6 = lVar6 + 1;
            lVar23 = lVar23 + 3;
          } while (lVar6 != 6);
          lVar22 = lVar22 + 1;
          lVar3 = lVar3 + 0x12;
        } while (lVar22 != 6);
        mpp_put_align(&local_108,0x80,0);
        pvVar18 = local_e8;
        lVar22 = 1;
        bVar1 = false;
      } while (bVar11);
      lVar3 = local_e0 + 1;
      local_118 = local_118 + 0x1b0;
    } while (lVar3 != 4);
    puVar5 = local_98;
    lVar3 = 0;
    do {
      lVar22 = -9;
      do {
        mpp_put_bits(&local_108,(ulong)*(byte *)((long)puVar5 + lVar22 + 9),8);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 0);
      lVar3 = lVar3 + 1;
      puVar5 = (undefined8 *)((long)puVar5 + 9);
    } while (lVar3 != 3);
    mpp_put_align(&local_108,0x80,0);
    lVar3 = 3;
    puVar20 = local_7d;
    do {
      lVar22 = 0;
      do {
        mpp_put_bits(&local_108,(ulong)(byte)puVar20[lVar22],8);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 9);
      lVar3 = lVar3 + 1;
      puVar20 = puVar20 + 9;
    } while (lVar3 != 6);
    mpp_put_align(&local_108,0x80,0);
    lVar3 = 6;
    puVar20 = local_62;
    do {
      lVar22 = 0;
      do {
        mpp_put_bits(&local_108,(ulong)(byte)puVar20[lVar22],8);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 9);
      lVar3 = lVar3 + 1;
      puVar20 = puVar20 + 9;
    } while (lVar3 != 9);
    lVar3 = 0;
    mpp_put_align(&local_108,0x80,0);
    do {
      mpp_put_bits(&local_108,(ulong)abStack_47[lVar3],8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 9);
    lVar3 = 0;
    mpp_put_align(&local_108,0x80,0);
    mpp_put_bits(&local_108,0,8);
    mpp_put_align(&local_108,0x80,0);
    do {
      mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + lVar3 + 0x192),8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + 0x195),8);
    mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + 0x1b6),8);
    lVar3 = 0;
    bVar1 = true;
    do {
      bVar11 = bVar1;
      lVar22 = 0;
      do {
        mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + lVar22 + lVar3 * 0x21 + 0x196),8);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 10);
      lVar3 = 1;
      bVar1 = false;
    } while (bVar11);
    mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + 0x1a0),8);
    mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + 0x1c1),8);
    lVar3 = 0;
    bVar1 = true;
    do {
      bVar11 = bVar1;
      lVar22 = 0;
      do {
        mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar18 + lVar22 + lVar3 * 0x21 + 0x1a1),8);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 10);
      lVar3 = 1;
      bVar1 = false;
    } while (bVar11);
    lVar3 = 0;
    bVar1 = true;
    do {
      bVar11 = bVar1;
      lVar22 = lVar3 * 0x21;
      lVar3 = 0;
      bVar1 = true;
      do {
        bVar21 = bVar1;
        lVar23 = -3;
        do {
          mpp_put_bits(&local_108,
                       (ulong)*(byte *)((long)pvVar18 + lVar23 + lVar3 * 3 + lVar22 + 0x1ae),8);
          pvVar7 = local_e8;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 0);
        lVar3 = 1;
        bVar1 = false;
      } while (bVar21);
      bVar1 = false;
    } while (bVar11);
    lVar3 = 0;
    bVar1 = true;
    do {
      bVar11 = bVar1;
      lVar22 = 0;
      do {
        mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar7 + lVar22 + lVar3 * 0x21 + 0x1b1),8);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 3);
      lVar3 = 1;
      bVar1 = false;
    } while (bVar11);
    mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar7 + 0x1b4),8);
    mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar7 + 0x1d5),8);
    mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar7 + 0x1b5),8);
    invalue = (RK_U64)*(byte *)((long)pvVar7 + 0x1d6);
  }
  else {
    pvVar18 = (void *)((long)pvVar18 + 0x207);
    lVar3 = 0;
    do {
      lVar22 = 0;
      local_e8 = pvVar18;
      bVar1 = true;
      do {
        bVar11 = bVar1;
        pvVar18 = (void *)(lVar22 * 0xd8 + (long)local_e8);
        lVar22 = 0;
        iVar17 = 0;
        do {
          lVar23 = 0;
          pvVar7 = pvVar18;
          do {
            lVar6 = -3;
            do {
              mpp_put_bits(&local_108,(ulong)*(byte *)((long)pvVar7 + lVar6 + 3),8);
              iVar17 = iVar17 + 1;
              if (iVar17 == 0x1b) {
                iVar17 = 0;
                mpp_put_align(&local_108,0x80,0);
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0);
            lVar23 = lVar23 + 1;
            pvVar7 = (void *)((long)pvVar7 + 3);
          } while (lVar23 != 6);
          lVar22 = lVar22 + 1;
          pvVar18 = (void *)((long)pvVar18 + 0x12);
        } while (lVar22 != 6);
        mpp_put_align(&local_108,0x80,0);
        lVar22 = 1;
        bVar1 = false;
      } while (bVar11);
      lVar3 = lVar3 + 1;
      pvVar18 = (void *)((long)local_e8 + 0x1b0);
    } while (lVar3 != 4);
    paavVar8 = vp9_kf_y_mode_prob;
    pavVar19 = vp9_kf_uv_mode_prob;
    uVar14 = 0;
    do {
      lVar3 = 0;
      iVar17 = 0;
      pavVar9 = *paavVar8;
      do {
        lVar22 = -9;
        do {
          mpp_put_bits(&local_108,(ulong)pavVar9[1][lVar22],8);
          iVar17 = iVar17 + 1;
          if (iVar17 == 0x1b) {
            iVar17 = 0;
            mpp_put_align(&local_108,0x80,0);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 0);
        lVar3 = lVar3 + 1;
        pavVar9 = pavVar9 + 1;
      } while (lVar3 != 10);
      if (uVar14 < 4) {
        uVar4 = (uint)(uVar14 != 3) * 2 + 0x15;
        uVar10 = (ulong)uVar4;
        uVar2 = 0x16;
        if (0x16 < uVar10) {
          uVar2 = uVar4;
        }
        uVar16 = 0xffffffffffffffff;
        uVar2 = uVar2 - ((uint)(uVar14 != 3) * 4 + 0x2a) | 2;
        do {
          uVar4 = uVar2;
          mpp_put_bits(&local_108,(ulong)*(vp9_prob *)((long)pavVar19 + uVar16 + 1),8);
          uVar16 = uVar16 + 1;
          uVar10 = uVar10 - 1;
          uVar2 = uVar4 + 1;
        } while (uVar10 != 0);
        if (uVar16 < 0x16) {
          do {
            mpp_put_bits(&local_108,0,8);
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
      }
      else {
        iVar17 = 0x17;
        do {
          mpp_put_bits(&local_108,0,8);
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      mpp_put_align(&local_108,0x80,0);
      uVar14 = uVar14 + 1;
      paavVar8 = (vp9_prob (*) [10] [9])((long)paavVar8 + 0x5a);
      pavVar19 = (vp9_prob (*) [9])((long)pavVar19 + 0x17);
    } while (uVar14 != 10);
    invalue = 0;
    mpp_put_bits(&local_108,0,8);
    mpp_put_align(&local_108,0x80,0);
  }
  mpp_put_bits(&local_108,invalue,8);
  mpp_put_align(&local_108,0x80,0);
  ptr = local_d8;
  memcpy(local_d0,local_d8,0x980);
  mpp_osal_free("hal_vp9d_output_probe",ptr);
  return MPP_OK;
}

Assistant:

MPP_RET hal_vp9d_output_probe(void *buf, void *dxva)
{
    RK_S32 i, j, k, m, n;
    RK_S32 fifo_len = 304;
    RK_U64 *probe_packet = NULL;
    BitputCtx_t bp;
    DXVA_PicParams_VP9 *pic_param = (DXVA_PicParams_VP9*)dxva;
    RK_S32 intraFlag = (!pic_param->frame_type || pic_param->intra_only);
    vp9_prob partition_probs[PARTITION_CONTEXTS][PARTITION_TYPES - 1];
    vp9_prob uv_mode_prob[INTRA_MODES][INTRA_MODES - 1];

    memset(buf, 0, 304 * 8);

    if (intraFlag) {
        memcpy(partition_probs, vp9_kf_partition_probs, sizeof(partition_probs));
        memcpy(uv_mode_prob, vp9_kf_uv_mode_prob, sizeof(uv_mode_prob));
    } else {
        memcpy(partition_probs, pic_param->prob.partition, sizeof(partition_probs));
        memcpy(uv_mode_prob, pic_param->prob.uv_mode, sizeof(uv_mode_prob));
    }

    probe_packet = mpp_calloc(RK_U64, fifo_len + 1);
    mpp_set_bitput_ctx(&bp, probe_packet, fifo_len);
    //sb info  5 x 128 bit
    for (i = 0; i < PARTITION_CONTEXTS; i++) //kf_partition_prob
        for (j = 0; j < PARTITION_TYPES - 1; j++)
            mpp_put_bits(&bp, partition_probs[i][j], 8); //48

    for (i = 0; i < PREDICTION_PROBS; i++) //Segment_id_pred_prob //3
        mpp_put_bits(&bp, pic_param->stVP9Segments.pred_probs[i], 8);

    for (i = 0; i < SEG_TREE_PROBS; i++) //Segment_id_probs
        mpp_put_bits(&bp, pic_param->stVP9Segments.tree_probs[i], 8); //7

    for (i = 0; i < SKIP_CONTEXTS; i++) //Skip_flag_probs //3
        mpp_put_bits(&bp, pic_param->prob.skip[i], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //6
        for (j = 0; j < TX_SIZES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.tx32p[i][j], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //4
        for (j = 0; j < TX_SIZES - 2; j++)
            mpp_put_bits(&bp, pic_param->prob.tx16p[i][j], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //2
        mpp_put_bits(&bp, pic_param->prob.tx8p[i], 8);

    for (i = 0; i < INTRA_INTER_CONTEXTS; i++) //Tx_size_probs //4
        mpp_put_bits(&bp, pic_param->prob.intra[i], 8);

    mpp_put_align(&bp, 128, 0);
    if (intraFlag) { //intra probs
        //intra only //149 x 128 bit ,aligned to 152 x 128 bit
        //coeff releated prob   64 x 128 bit
        for (i = 0; i < TX_SIZES; i++)
            for (j = 0; j < PLANE_TYPES; j++) {
                RK_S32 byte_count = 0;
                for (k = 0; k < COEF_BANDS; k++) {
                    for (m = 0; m < COEFF_CONTEXTS; m++)
                        for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                            mpp_put_bits(&bp, pic_param->prob.coef[i][j][0][k][m][n], 8);

                            byte_count++;
                            if (byte_count == 27) {
                                mpp_put_align(&bp, 128, 0);
                                byte_count = 0;
                            }
                        }
                }
                mpp_put_align(&bp, 128, 0);
            }

        //intra mode prob  80 x 128 bit
        for (i = 0; i < INTRA_MODES; i++) { //vp9_kf_y_mode_prob
            RK_S32 byte_count = 0;
            for (j = 0; j < INTRA_MODES; j++)
                for (k = 0; k < INTRA_MODES - 1; k++) {
                    mpp_put_bits(&bp, vp9_kf_y_mode_prob[i][j][k], 8);
                    byte_count++;
                    if (byte_count == 27) {
                        byte_count = 0;
                        mpp_put_align(&bp, 128, 0);
                    }

                }
            if (i < 4) {
                for (m = 0; m < (i < 3 ? 23 : 21); m++)
                    mpp_put_bits(&bp, ((vp9_prob *)(&vp9_kf_uv_mode_prob[0][0]))[i * 23 + m], 8);
                for (; m < 23; m++)
                    mpp_put_bits(&bp, 0, 8);
            } else {
                for (m = 0; m < 23; m++)
                    mpp_put_bits(&bp, 0, 8);
            }
            mpp_put_align(&bp, 128, 0);
        }
        //align to 152 x 128 bit
        for (i = 0; i < INTER_PROB_SIZE_ALIGN_TO_128 - INTRA_PROB_SIZE_ALIGN_TO_128; i++) { //aligned to 153 x 256 bit
            mpp_put_bits(&bp, 0, 8);
            mpp_put_align(&bp, 128, 0);
        }
    } else {
        //inter probs
        //151 x 128 bit ,aligned to 152 x 128 bit
        //inter only

        //intra_y_mode & inter_block info   6 x 128 bit
        for (i = 0; i < BLOCK_SIZE_GROUPS; i++) //intra_y_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.y_mode[i][j], 8);

        for (i = 0; i < COMP_INTER_CONTEXTS; i++) //reference_mode prob
            mpp_put_bits(&bp, pic_param->prob.comp[i], 8);

        for (i = 0; i < REF_CONTEXTS; i++) //comp ref bit
            mpp_put_bits(&bp, pic_param->prob.comp_ref[i], 8);

        for (i = 0; i < REF_CONTEXTS; i++) //single ref bit
            for (j = 0; j < 2; j++)
                mpp_put_bits(&bp, pic_param->prob.single_ref[i][j], 8);

        for (i = 0; i < INTER_MODE_CONTEXTS; i++) //mv mode bit
            for (j = 0; j < INTER_MODES - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.mv_mode[i][j], 8);


        for (i = 0; i < SWITCHABLE_FILTER_CONTEXTS; i++) //comp ref bit
            for (j = 0; j < SWITCHABLE_FILTERS - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.filter[i][j], 8);

        mpp_put_align(&bp, 128, 0);

        //128 x 128bit
        //coeff releated
        for (i = 0; i < TX_SIZES; i++)
            for (j = 0; j < PLANE_TYPES; j++) {
                RK_S32 byte_count = 0;
                for (k = 0; k < COEF_BANDS; k++) {
                    for (m = 0; m < COEFF_CONTEXTS; m++)
                        for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                            mpp_put_bits(&bp, pic_param->prob.coef[i][j][0][k][m][n], 8);
                            byte_count++;
                            if (byte_count == 27) {
                                mpp_put_align(&bp, 128, 0);
                                byte_count = 0;
                            }
                        }
                }
                mpp_put_align(&bp, 128, 0);
            }
        for (i = 0; i < TX_SIZES; i++)
            for (j = 0; j < PLANE_TYPES; j++) {
                RK_S32 byte_count = 0;
                for (k = 0; k < COEF_BANDS; k++) {
                    for (m = 0; m < COEFF_CONTEXTS; m++) {
                        for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                            mpp_put_bits(&bp, pic_param->prob.coef[i][j][1][k][m][n], 8);
                            byte_count++;
                            if (byte_count == 27) {
                                mpp_put_align(&bp, 128, 0);
                                byte_count = 0;
                            }
                        }

                    }
                }
                mpp_put_align(&bp, 128, 0);
            }

        //intra uv mode 6 x 128
        for (i = 0; i < 3; i++) //intra_uv_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, uv_mode_prob[i][j], 8);
        mpp_put_align(&bp, 128, 0);

        for (; i < 6; i++) //intra_uv_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, uv_mode_prob[i][j], 8);
        mpp_put_align(&bp, 128, 0);

        for (; i < 9; i++) //intra_uv_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, uv_mode_prob[i][j], 8);
        mpp_put_align(&bp, 128, 0);
        for (; i < INTRA_MODES; i++) //intra_uv_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, uv_mode_prob[i][j], 8);

        mpp_put_align(&bp, 128, 0);
        mpp_put_bits(&bp, 0, 8);
        mpp_put_align(&bp, 128, 0);

        //mv releated 6 x 128
        for (i = 0; i < MV_JOINTS - 1; i++) //mv_joint_type
            mpp_put_bits(&bp, pic_param->prob.mv_joint[i], 8);

        for (i = 0; i < 2; i++) { //sign bit
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].sign, 8);
        }
        for (i = 0; i < 2; i++) { //classes bit
            for (j = 0; j < MV_CLASSES - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.mv_comp[i].classes[j], 8);
        }
        for (i = 0; i < 2; i++) { //classe0 bit
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0, 8);
        }
        for (i = 0; i < 2; i++) { // bits
            for (j = 0; j < MV_OFFSET_BITS; j++)
                mpp_put_bits(&bp, pic_param->prob.mv_comp[i].bits[j], 8);
        }
        for (i = 0; i < 2; i++) { //class0_fp bit
            for (j = 0; j < CLASS0_SIZE; j++)
                for (k = 0; k < MV_FP_SIZE - 1; k++)
                    mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0_fp[j][k], 8);
        }
        for (i = 0; i < 2; i++) { //comp ref bit
            for (j = 0; j < MV_FP_SIZE - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.mv_comp[i].fp[j], 8);
        }
        for (i = 0; i < 2; i++) { //class0_hp bit

            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0_hp, 8);
        }
        for (i = 0; i < 2; i++) { //hp bit
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].hp, 8);
        }
        mpp_put_align(&bp, 128, 0);
    }

    memcpy(buf, probe_packet, 304 * 8);

#ifdef dump
    if (intraFlag) {
        fwrite(probe_packet, 1, 302 * 8, vp9_fp);
    } else {
        fwrite(probe_packet, 1, 304 * 8, vp9_fp);
    }
    fflush(vp9_fp);
#endif
    MPP_FREE(probe_packet);

    return 0;
}